

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_dump.cpp
# Opt level: O0

void __thiscall hex_dump::dump(hex_dump *this,interface *config,uint8_t *begin,size_t size)

{
  ostream *poVar1;
  uint8_t uVar2;
  uint8_t *local_38;
  uint8_t *line_start;
  size_t char_cnt;
  size_t size_local;
  uint8_t *begin_local;
  interface *config_local;
  hex_dump *this_local;
  
  line_start = (uint8_t *)0x10;
  line_header(this,config);
  local_38 = begin;
  char_cnt = size;
  size_local = (size_t)begin;
  while (char_cnt != 0) {
    print_hex(this->output_,*(uint8_t *)size_local);
    std::operator<<(this->output_,' ');
    char_cnt = char_cnt - 1;
    size_local = size_local + 1;
    line_start = line_start + -1;
    if ((line_start == (uint8_t *)0x0) || (char_cnt == 0)) {
      for (; line_start != (uint8_t *)0x0; line_start = line_start + -1) {
        std::operator<<(this->output_,"   ");
      }
      for (; local_38 != (uint8_t *)size_local; local_38 = local_38 + 1) {
        poVar1 = this->output_;
        uVar2 = as_printable(*local_38);
        std::operator<<(poVar1,uVar2);
      }
      std::operator<<(this->output_,'\n');
      if (char_cnt != 0) {
        line_header(this,config);
      }
      line_start = (uint8_t *)0x10;
    }
  }
  return;
}

Assistant:

void hex_dump::dump( const interface& config, const std::uint8_t* begin, std::size_t size )
{
    static const std::size_t page_width = 16;
    std::size_t              char_cnt   = page_width;
    const std::uint8_t*      line_start = begin;

    line_header( config );

    while ( size )
    {
        print_hex( output_, *begin );
        output_ << ' ';

        --size;
        ++begin;
        --char_cnt;

        if ( char_cnt == 0 || size == 0 )
        {
            // fill rest of the line
            for ( ; char_cnt != 0; --char_cnt)
                output_ << "   ";

            for ( ; line_start != begin; ++line_start )
                output_ << as_printable( *line_start );

            output_ << '\n';

            if ( size )
                line_header( config );

            char_cnt   = page_width;
        }
    }
}